

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O3

bool __thiscall
Centaurus::DFA<char>::run
          (DFA<char> *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq,
          int index,int input_pos)

{
  pointer pDVar1;
  pointer pNVar2;
  bool bVar3;
  byte bVar4;
  pointer pNVar5;
  Range<char> *mr;
  pointer pRVar6;
  
  pDVar1 = (this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (seq->_M_string_length == (long)input_pos) {
    bVar4 = pDVar1[index].m_accept;
  }
  else {
    pNVar5 = pDVar1[index].super_NFABaseState<char,_Centaurus::IndexVector>.m_transitions.
             super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar2 = *(pointer *)
              ((long)&pDVar1[index].super_NFABaseState<char,_Centaurus::IndexVector>.m_transitions.
                      super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              + 8);
    if (pNVar5 != pNVar2) {
      bVar4 = (seq->_M_dataplus)._M_p[input_pos];
      do {
        for (pRVar6 = (pNVar5->m_label).m_ranges.
                      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pRVar6 != *(pointer *)
                       ((long)&(pNVar5->m_label).m_ranges.
                               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                       + 8); pRVar6 = pRVar6 + 1) {
          if (((byte)pRVar6->m_start <= bVar4) && (bVar4 < (byte)pRVar6->m_end)) {
            bVar3 = run(this,seq,pNVar5->m_dest,input_pos + 1);
            input_pos = (int)bVar3;
            bVar4 = 1;
            goto LAB_00117c86;
          }
        }
        pNVar5 = pNVar5 + 1;
      } while (pNVar5 != pNVar2);
    }
    bVar4 = 0;
LAB_00117c86:
    bVar4 = bVar4 & (byte)input_pos;
  }
  return (bool)bVar4;
}

Assistant:

bool run(const std::basic_string<TCHAR>& seq, int index = 0, int input_pos = 0) const
	{
		const DFAState<TCHAR>& state = m_states[index];
		if (input_pos == seq.size())
		{
			return state.is_accept();
		}
		else
		{
			for (const auto& tr : state.get_transitions())
			{
				if (tr.label().includes(seq[input_pos]))
				{
					return run(seq, tr.dest(), input_pos + 1);
				}
			}
			return false;
		}
	}